

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mllr.c
# Opt level: O1

int32 compute_mllr(float32 *****regl,float32 ****regr,uint32 *veclen,uint32 nclass,uint32 nfeat,
                  uint32 mllrmult,uint32 mllradd,float32 *****A,float32 ****B)

{
  uint n;
  float32 *pfVar1;
  int32 iVar2;
  float32 ****ppppfVar3;
  float32 ***pppfVar4;
  float32 **ppfVar5;
  float32 *pfVar6;
  ulong uVar7;
  ulong uVar8;
  ulong d1;
  ulong d1_00;
  ulong uVar9;
  ulong d2;
  ulong uVar10;
  bool bVar11;
  bool bVar12;
  float fVar13;
  float32 fVar14;
  
  d1_00 = (ulong)nclass;
  d2 = (ulong)nfeat;
  ppppfVar3 = (float32 ****)
              __ckd_calloc_2d__(d1_00,d2,8,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmllr/mllr.c"
                                ,0x6f);
  pppfVar4 = (float32 ***)
             __ckd_calloc_2d__(d1_00,d2,8,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmllr/mllr.c"
                               ,0x70);
  if (nclass != 0) {
    bVar11 = mllradd == 0;
    bVar12 = mllrmult != 0;
    uVar9 = 0;
    do {
      if (nfeat != 0) {
        uVar10 = 0;
        do {
          n = veclen[uVar10];
          d1 = (ulong)n;
          ppfVar5 = (float32 **)
                    __ckd_calloc_2d__(d1,d1,4,
                                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmllr/mllr.c"
                                      ,0x84);
          ppppfVar3[uVar9][uVar10] = ppfVar5;
          pfVar6 = (float32 *)
                   __ckd_calloc__(d1,4,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmllr/mllr.c"
                                  ,0x85);
          pppfVar4[uVar9][uVar10] = pfVar6;
          pfVar6 = (float32 *)
                   __ckd_calloc__((ulong)(n + 1),8,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmllr/mllr.c"
                                  ,0x86);
          if (bVar12 && bVar11) {
            err_msg(ERR_INFO,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmllr/mllr.c"
                    ,0x8a,"Computing only multiplicative part of MLLR\n");
            if (d1 != 0) {
              memset(pppfVar4[uVar9][uVar10],0,d1 * 4);
              uVar8 = 0;
              do {
                iVar2 = solve(regl[uVar9][uVar10][uVar8],regr[uVar9][uVar10][uVar8],pfVar6,n);
                if (iVar2 == 0) {
                  pfVar1 = ppppfVar3[uVar9][uVar10][uVar8];
                  uVar7 = 0;
                  do {
                    pfVar1[uVar7] = pfVar6[uVar7];
                    uVar7 = uVar7 + 1;
                  } while (d1 != uVar7);
                }
                else {
                  err_msg(ERR_INFO,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmllr/mllr.c"
                          ,0x92,"Estimation of %d th multiplicative",
                          " term in MLLR regression failed\n",uVar8 & 0xffffffff);
                  pfVar1 = ppppfVar3[uVar9][uVar10][uVar8];
                  memset(pfVar1,0,d1 * 4);
                  pfVar1[uVar8] = 1.0;
                }
                uVar8 = uVar8 + 1;
              } while (uVar8 != d1);
            }
          }
          else if (bVar12 || bVar11) {
            if (!bVar12 || bVar11) {
              if (mllradd == 0 && mllrmult == 0) {
                err_msg(ERR_FATAL,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmllr/mllr.c"
                        ,0xcb,"ERROR: MLLR flags are not set\n");
                exit(1);
              }
            }
            else {
              err_msg(ERR_INFO,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmllr/mllr.c"
                      ,0xb6,"Computing both multiplicative and additive part of MLLR\n");
              if (d1 != 0) {
                uVar8 = 0;
                do {
                  iVar2 = solve(regl[uVar9][uVar10][uVar8],regr[uVar9][uVar10][uVar8],pfVar6,n + 1);
                  if (iVar2 == 0) {
                    pfVar1 = ppppfVar3[uVar9][uVar10][uVar8];
                    uVar7 = 0;
                    do {
                      pfVar1[uVar7] = pfVar6[uVar7];
                      uVar7 = uVar7 + 1;
                    } while (d1 != uVar7);
                    fVar14 = pfVar6[d1];
                  }
                  else {
                    err_msg(ERR_INFO,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmllr/mllr.c"
                            ,0xba,"Estimation of %d th regression in MLLR failed\n",
                            uVar8 & 0xffffffff);
                    pfVar1 = ppppfVar3[uVar9][uVar10][uVar8];
                    memset(pfVar1,0,d1 * 4);
                    pfVar1[uVar8] = 1.0;
                    fVar14 = 0.0;
                  }
                  pppfVar4[uVar9][uVar10][uVar8] = fVar14;
                  uVar8 = uVar8 + 1;
                } while (uVar8 != d1);
              }
            }
          }
          else {
            err_msg(ERR_INFO,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmllr/mllr.c"
                    ,0xa1,"Computing only additive part of MLLR\n");
            if (d1 != 0) {
              ppfVar5 = ppppfVar3[uVar9][uVar10];
              uVar8 = 0;
              do {
                pfVar1 = ppfVar5[uVar8];
                memset(pfVar1,0,d1 << 2);
                pfVar1[uVar8] = 1.0;
                uVar8 = uVar8 + 1;
              } while (d1 != uVar8);
              uVar8 = 0;
              do {
                fVar13 = (float)regl[uVar9][uVar10][uVar8][d1][d1];
                if (fVar13 <= 1.2e-38) {
                  err_msg(ERR_INFO,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmllr/mllr.c"
                          ,0xaf,
                          "%th dimension of addition term of %dth MLLR adaptation underflow!\nSet to zero...\n"
                          ,uVar8 & 0xffffffff);
                  fVar13 = 0.0;
                }
                else {
                  fVar13 = ((float)regr[uVar9][uVar10][uVar8][d1] -
                           (float)regl[uVar9][uVar10][uVar8][d1][uVar8]) / fVar13;
                }
                pppfVar4[uVar9][uVar10][uVar8] = (float32)fVar13;
                uVar8 = uVar8 + 1;
              } while (d1 != uVar8);
            }
          }
          ckd_free(pfVar6);
          uVar10 = uVar10 + 1;
        } while (uVar10 != d2);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != d1_00);
  }
  *A = ppppfVar3;
  *B = pppfVar4;
  return 0;
}

Assistant:

int32
compute_mllr (
             float32 *****regl,
             float32 ****regr,
             const uint32  *veclen,
             uint32  nclass,
             uint32  nfeat,
             uint32  mllrmult,
             uint32  mllradd,
             float32 *****A,
             float32 ****B
            )
{
    uint32  i,j,k,m,len;
    float32 ****Aloc, ***Bloc;
    float32 *ABloc=NULL;

    Aloc = (float32 ****) ckd_calloc_2d(nclass, nfeat, sizeof(float32 ***));
    Bloc = (float32 ***) ckd_calloc_2d(nclass, nfeat, sizeof(float32 **));

#if 0
    dump_regmat_statistics(regl,
			   regr,
			   nclass,
			   nfeat
			   veclen);

#endif
    /* Here, regl is the same as Legetter's G, while regr is Z.  The
     * original papers use the formula w_i^T = G(i)^{-1} z_i^T to
     * calculate the rows of W (the transformation matrix).  However
     * what they really mean by this is that we solve for w_i^T in the
     * equation G(i) w_i^T = z_i^T.  That is what this code does,
     * optionally omitting the bias or rotation parts of W. */
    for (m = 0; m < nclass; m++) {
	for (i = 0; i < nfeat; i++) {
	    len = veclen[i];

	    Aloc[m][i] = (float32 **) ckd_calloc_2d(len, len, sizeof(float32));
	    Bloc[m][i] = (float32 *) ckd_calloc(len, sizeof(float32));
	    ABloc = (float32 *) ckd_calloc(len+1, sizeof(float64));
 
	    if (mllrmult && !mllradd) {
		/* Compute only multiplicative part of MLLR*/
		E_INFO("Computing only multiplicative part of MLLR\n"); 
		for (j = 0; j < len; j++) {
		    Bloc[m][i][j] = 0.0;
		}
		for (j = 0; j < len; ++j) {
		    /** If estimation of rotation not possible, dont rotate **/
		    if (solve(regl[m][i][j],regr[m][i][j],ABloc,len) != S3_SUCCESS){
			E_INFO("Estimation of %d th multiplicative",
			       " term in MLLR regression failed\n",j);
			for (k = 0;k < len; k++) {
			    Aloc[m][i][j][k] = 0.0;
			}
			Aloc[m][i][j][j] = 1.0;
		    }
		    else {
			for (k = 0; k < len; k++) {
			    Aloc[m][i][j][k] = ABloc[k];
			}
		    }
		}
	    }
	    else if(!mllrmult && mllradd){
		/* Compute only additive part of MLLR*/
		E_INFO("Computing only additive part of MLLR\n"); 
		for (j = 0; j < len; j++) {
		    for (k = 0; k < len; k++) {
			Aloc[m][i][j][k] = 0.0;
		    }
		    Aloc[m][i][j][j] = 1.0;
		}
		for (j = 0; j < len; j++) {
		    /** If estimation of shift not possible, dont shift **/
		    if (regl[m][i][j][len][len] > MIN_IEEE_NORM_POS_FLOAT32) {
			Bloc[m][i][j] = (regr[m][i][j][len]-regl[m][i][j][len][j])/
			    regl[m][i][j][len][len];
		    }
		    else {
			E_INFO("%th dimension of addition term of %dth MLLR adaptation underflow!\nSet to zero...\n",j);
			Bloc[m][i][j] = 0.0;
		    }
		}
	    }
	    else if (mllrmult && mllradd) {
		/* Compute both multiplicative and additive part of MLLR*/
		E_INFO("Computing both multiplicative and additive part of MLLR\n");
		for (j = 0; j < len; ++j) {
		    /** If estimation of regression not possible, dont do anything **/
		    if (solve(regl[m][i][j],regr[m][i][j],ABloc,len+1) != S3_SUCCESS) {
			E_INFO("Estimation of %d th regression in MLLR failed\n",j);
			for (k = 0;k < len; k++) {
			    Aloc[m][i][j][k] = 0.0;
			}
			Aloc[m][i][j][j] = 1.0;
			Bloc[m][i][j] = 0.0;
		    }
		    else {
			for (k = 0; k < len; ++k) {
			    Aloc[m][i][j][k] = ABloc[k];
			}
			Bloc[m][i][j] = ABloc[len];
		    }
		}
	    }
	    else if(!mllrmult && !mllradd){
		/*MLLR flags are not set - Error*/
		E_FATAL("ERROR: MLLR flags are not set\n"); 
	    }
	    ckd_free(ABloc);
	}
    }
    *A = Aloc;
    *B = Bloc;

    return S3_SUCCESS;
}